

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O1

void end_macro(void)

{
  int *piVar1;
  TokenString *p;
  
  p = macro_stack;
  macro_ptr = macro_stack->prev_ptr;
  piVar1 = &macro_stack->save_line_num;
  macro_stack = macro_stack->prev;
  file->line_num = *piVar1;
  if (p->alloc == '\x02') {
    p->alloc = '\x03';
    return;
  }
  tal_free_impl(tokstr_alloc,p->str);
  tal_free_impl(tokstr_alloc,p);
  return;
}

Assistant:

ST_FUNC void end_macro(void) {
  TokenString* str = macro_stack;
  macro_stack = str->prev;
  macro_ptr = str->prev_ptr;
  file->line_num = str->save_line_num;
  if (str->alloc == 2) {
    str->alloc = 3; /* just mark as finished */
  } else {
    tok_str_free(str);
  }
}